

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O3

void __thiscall
cmFindLibraryCommand::AddArchitecturePath
          (cmFindLibraryCommand *this,string *dir,size_type start_pos,char *suffix,bool fresh)

{
  pointer pcVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  long *plVar5;
  size_type *psVar6;
  string next_dir;
  string cur_dir;
  string local_98;
  cmFindLibraryCommand *local_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_78 = this;
  lVar3 = std::__cxx11::string::find((char *)dir,0x4e8812,start_pos);
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)dir);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    std::__cxx11::string::append((char *)&local_98);
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_98);
    if (bVar2) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)dir);
      std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      sVar4 = strlen(suffix);
      AddArchitecturePath(local_78,&local_98,lVar3 + sVar4 + 4,suffix,true);
    }
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_70);
    if (bVar2) {
      AddArchitecturePath(local_78,dir,lVar3 + 4,suffix,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if (fresh) {
    pcVar1 = (dir->_M_dataplus)._M_p;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar1,pcVar1 + dir->_M_string_length);
    std::__cxx11::string::append((char *)&local_98);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70.field_2._8_8_ = plVar5[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_70._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_70);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(local_78->super_cmFindBase).super_cmFindCommon.SearchPaths,&local_70);
    }
    bVar2 = cmsys::SystemTools::FileIsDirectory(dir);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(local_78->super_cmFindBase).super_cmFindCommon.SearchPaths,dir);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmFindLibraryCommand::AddArchitecturePath(
  std::string const& dir, std::string::size_type start_pos,
  const char* suffix, bool fresh)
{
  std::string::size_type pos = dir.find("lib/", start_pos);
  if(pos != std::string::npos)
    {
    std::string cur_dir  = dir.substr(0,pos+3);

    // Follow "lib<suffix>".
    std::string next_dir = cur_dir + suffix;
    if(cmSystemTools::FileIsDirectory(next_dir))
      {
      next_dir += dir.substr(pos+3);
      std::string::size_type next_pos = pos+3+strlen(suffix)+1;
      this->AddArchitecturePath(next_dir, next_pos, suffix);
      }

    // Follow "lib".
    if(cmSystemTools::FileIsDirectory(cur_dir))
      {
      this->AddArchitecturePath(dir, pos+3+1, suffix, false);
      }
    }
  if(fresh)
    {
    // Check for <dir><suffix>/.
    std::string cur_dir  = dir + suffix + "/";
    if(cmSystemTools::FileIsDirectory(cur_dir))
      {
      this->SearchPaths.push_back(cur_dir);
      }

    // Now add the original unchanged path
    if(cmSystemTools::FileIsDirectory(dir))
      {
      this->SearchPaths.push_back(dir);
      }
    }
}